

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O2

int sx_os_numcores(void)

{
  long lVar1;
  
  lVar1 = sysconf(0x54);
  return (int)lVar1;
}

Assistant:

int sx_os_numcores(void)
{
#if SX_PLATFORM_WINDOWS
    SYSTEM_INFO sysinfo;
    GetSystemInfo(&sysinfo);
    return sysinfo.dwNumberOfProcessors;
#elif SX_PLATFORM_LINUX || SX_PLATFORM_RPI
    return sysconf(_SC_NPROCESSORS_ONLN);
#elif SX_PLATFORM_ANDROID
    return android_getCpuCount();
#elif SX_PLATFORM_APPLE
    int ncpu;
    size_t ncpu_len = sizeof(ncpu);
    // hw.physicalcpu - The number of physical processors available in the current power management
    // mode. hw.physicalcpu_max - The maximum number of physical processors that could be available
    // this boot. hw.logicalcpu - The number of logical processors available in the current power
    // management mode. hw.logicalcpu_max - The maximum number of logical processors that could be
    // available this boot.
    if (sysctlbyname("hw.logicalcpu", &ncpu, &ncpu_len, NULL, 0) == 0)
        return ncpu;
    return 1;
#elif SX_PLATFORM_BSD
    int ctlarg[2], ncpu;
    size_t len;

    ctlarg[0] = CTL_HW;
    ctlarg[1] = HW_NCPU;
    len = sizeof(ncpu);
    if (sysctl(ctlarg, 2, &ncpu, &len, 0, 0) == 0)
        return ncpu;
    return 1;
#endif
}